

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  istream *in_00;
  status_type S_new;
  delim_c local_2a;
  delim_c local_29;
  result_type local_28;
  
  local_28 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_29.c = '(';
  pbVar3 = utility::operator>>(in,&local_29);
  in_00 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar3);
  local_2a.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_2a);
  lVar2 = *(long *)in;
  if (((byte)in[*(long *)(lVar2 + -0x18) + 0x20] & 5) == 0) {
    S->r = local_28;
  }
  *(undefined4 *)(in + *(long *)(lVar2 + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.r >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }